

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O2

char * pstrcat(char *buf,int buf_size,char *s)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = strlen(buf);
  iVar1 = (int)sVar2;
  if (buf_size - iVar1 != 0 && iVar1 <= buf_size) {
    pstrcpy(buf + iVar1,buf_size - iVar1,s);
  }
  return buf;
}

Assistant:

char *pstrcat(char *buf, int buf_size, const char *s)
{
    int len;
    len = strlen(buf);
    if (len < buf_size)
        pstrcpy(buf + len, buf_size - len, s);
    return buf;
}